

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_const_element_vector_provider.cc
# Opt level: O0

VectorXd __thiscall
projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider::Eval
          (PiecewiseConstElementVectorProvider *this,Entity *entity)

{
  Index *this_00;
  uint uVar1;
  int iVar2;
  size_type sVar3;
  undefined4 extraout_var;
  MatrixXd *pMVar5;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  CoeffReturnType scalar;
  undefined4 extraout_var_00;
  reference ppEVar6;
  byte *pbVar7;
  CoeffReturnType pdVar8;
  DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_02;
  Scalar *pSVar9;
  Entity *in_RDX;
  Index extraout_RDX;
  Scalar SVar10;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar11;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  PVar12;
  VectorXd VVar13;
  non_const_type local_458;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_450;
  double local_440;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_438;
  undefined1 local_418 [8];
  Vector2d t;
  Entity *edge;
  undefined1 auStack_3f8 [4];
  int edge_idx;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> edges;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  undefined1 local_3b0 [8];
  MatrixXd vertices;
  non_const_type local_360;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  local_358;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
  local_330;
  ConstColXpr local_300;
  Matrix<double,2,1,0,2,1> local_2c8 [16];
  undefined1 local_2b8 [8];
  Matrix<double,_2,_1,_0,_2,_1> f_eval;
  ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> AStack_2a0;
  size_type n;
  Matrix<double,__1,_1,_0,__1,_1> local_298;
  NestedExpressionType local_288;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_280;
  MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_268;
  undefined1 local_250 [8];
  VectorXd weights;
  MatrixXd points;
  ConstRowXpr local_208;
  NegativeReturnType local_1d0;
  ConstRowXpr local_190;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_158;
  int local_138 [2];
  undefined1 local_130 [8];
  MatrixXd basis_funct;
  undefined1 local_108 [8];
  MatrixXd grads;
  Matrix<double,__1,__1,_0,__1,__1> local_d8;
  undefined1 local_c0 [8];
  MatrixXd J_inv_trans;
  ConstantReturnType local_98;
  Matrix<double,__1,__1,_0,__1,__1> local_80;
  Matrix<double,__1,__1,_0,__1,__1> local_68;
  non_const_type local_50;
  undefined1 local_48 [8];
  MatrixXd ref_grads;
  FeLagrangeO1Tria<double> hat_func;
  Geometry *geom;
  Entity *entity_local;
  PiecewiseConstElementVectorProvider *this_local;
  VectorXd *element_vector;
  long *plVar4;
  
  iVar2 = (*in_RDX->_vptr_Entity[3])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  this_00 = &ref_grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
  lf::uscalfe::FeLagrangeO1Tria<double>::FeLagrangeO1Tria((FeLagrangeO1Tria<double> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_98,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98);
  lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
            (&local_68,(FeLagrangeO1Tria<double> *)this_00,(MatrixXd *)&local_80);
  local_50 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_68);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_48,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_50);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_80);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,2);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&grads.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  (**(code **)(*plVar4 + 0x28))(local_c0,plVar4,&local_d8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_d8);
  PVar11 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_c0,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
  basis_funct.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)PVar11.m_lhs;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_108,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&basis_funct.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols);
  local_138[1] = 2;
  local_138[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_130,local_138 + 1,local_138);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_190,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_108,1);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
            (&local_158,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_130,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)&local_190);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (&local_208,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_108,0);
  Eigen::DenseBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
  operator-(&local_1d0,
            (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
             *)&local_208);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_158,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_1d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_158);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,6);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
  pMVar5 = lf::quad::QuadRule::Points((QuadRule *)(entity + 5));
  (**(code **)(*plVar4 + 0x18))
            (&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,plVar4,pMVar5);
  pMVar5 = lf::quad::QuadRule::Points((QuadRule *)(entity + 5));
  (**(code **)(*plVar4 + 0x30))(&local_298,plVar4,pMVar5);
  local_288 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_298);
  this_01 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
            lf::quad::QuadRule::Weights((QuadRule *)(entity + 5));
  AStack_2a0 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array(this_01);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
            (&local_280,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_288,
             (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             &stack0xfffffffffffffd60);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
  ::matrix(&local_268,
           (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
            *)&local_280);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_250,
             (EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
              *)&local_268);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_298);
  for (f_eval.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       ._4_4_ = 0;
      uVar1 = f_eval.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array[1]._4_4_, sVar3 = lf::quad::QuadRule::NumPoints((QuadRule *)(entity + 5)),
      uVar1 < sVar3;
      f_eval.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1].
      _4_4_ = f_eval.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array[1]._4_4_ + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_300,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(ulong)f_eval.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                              m_storage.m_data.array[1]._4_4_);
    Eigen::Matrix<double,2,1,0,2,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
              (local_2c8,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                *)&local_300);
    std::
    function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>::
    operator()((function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
                *)local_2b8,(Matrix<double,_2,_1,_0,_2,_1> *)(entity + 1));
    local_360 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_130);
    scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)local_250,
                        (ulong)f_eval.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                               m_storage.m_data.array[1]._4_4_);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
              (&local_358,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&local_360,
               scalar);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const>>
    ::operator*(&local_330,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                 *)&local_358,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_2b8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)&vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
               &vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>_>
                        *)&local_330);
  }
  iVar2 = (*in_RDX->_vptr_Entity[4])();
  normals.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5].
  _7_1_ = (undefined1)iVar2;
  pMVar5 = lf::base::RefEl::NodeCoords
                     ((RefEl *)((long)normals.
                                      super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                                      m_storage.m_data.array + 0x2f));
  (**(code **)(*plVar4 + 0x18))(local_3b0,plVar4,pMVar5);
  ipdg_stokes::mesh::computeOutwardNormals((Matrix<double,_2,_3,_0,_2,_3> *)&edges._M_extent,in_RDX)
  ;
  iVar2 = (*in_RDX->_vptr_Entity[1])(in_RDX,1);
  _auStack_3f8 = (pointer)CONCAT44(extraout_var_00,iVar2);
  for (edge._4_4_ = 0; edge._4_4_ < 3; edge._4_4_ = edge._4_4_ + 1) {
    ppEVar6 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                        ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)auStack_3f8,
                         (long)edge._4_4_);
    t.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (double)*ppEVar6;
    pbVar7 = (byte *)(**(code **)*entity[0xb]._vptr_Entity)
                               (entity[0xb]._vptr_Entity,
                                t.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                m_storage.m_data.array[1]);
    if ((*pbVar7 & 1) != 0) {
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_418);
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)
                          &edges._M_extent,1,(long)edge._4_4_);
      local_440 = -*pdVar8;
      Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
                (&local_438,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_418,&local_440
                );
      pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)
                          &edges._M_extent,0,(long)edge._4_4_);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_438,pdVar8);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_438);
      this_02 = (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                (**(code **)*entity[0xc]._vptr_Entity)
                          (entity[0xc]._vptr_Entity,
                           t.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                           m_data.array[1]);
      local_458 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::transpose(this_02);
      PVar12 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>> *)
                          &local_458,(MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_418)
      ;
      local_450 = PVar12;
      SVar10 = Eigen::internal::dense_product_base::operator_cast_to_double
                         ((dense_product_base *)&local_450);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                          (long)(edge._4_4_ + 3));
      *pSVar9 = SVar10;
    }
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_3b0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_250);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_130);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_108);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_48);
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       &this->sigma_;
  return (VectorXd)VVar13.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd PiecewiseConstElementVectorProvider::Eval(
    const lf::mesh::Entity &entity) const {
  const auto *const geom = entity.Geometry();
  // Construct the basis functions from the curl of the standard hat functions
  const lf::uscalfe::FeLagrangeO1Tria<double> hat_func;
  const Eigen::MatrixXd ref_grads =
      hat_func.GradientsReferenceShapeFunctions(Eigen::VectorXd::Zero(2))
          .transpose();
  const Eigen::MatrixXd J_inv_trans =
      geom->JacobianInverseGramian(Eigen::VectorXd::Zero(2));
  const Eigen::MatrixXd grads = J_inv_trans * ref_grads;
  Eigen::MatrixXd basis_funct(2, 3);
  basis_funct << grads.row(1), -grads.row(0);
  // Compute the elements of the vector via the given quadrature rule
  Eigen::VectorXd element_vector = Eigen::VectorXd::Zero(6);
  const Eigen::MatrixXd points = geom->Global(quadrule_.Points());
  const Eigen::VectorXd weights =
      (geom->IntegrationElement(quadrule_.Points()).array() *
       quadrule_.Weights().array())
          .matrix();
  for (lf::base::size_type n = 0; n < quadrule_.NumPoints(); ++n) {
    const auto f_eval = f_(points.col(n));
    element_vector.head(3) += basis_funct.transpose() * weights[n] * f_eval;
  }
  // Weakly impose the dirichlet boundary conditions
  const Eigen::MatrixXd vertices = geom->Global(entity.RefEl().NodeCoords());
  // Use the vertex coordinates to compute the local normals on the edges
  const Eigen::Matrix<double, 2, 3> normals =
      projects::ipdg_stokes::mesh::computeOutwardNormals(entity);
  // Iterate over all edges of the current entity and set the boundary
  // conditions where necessary
  const auto edges = entity.SubEntities(1);
  for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
    const auto &edge = *edges[edge_idx];
    if (boundary_(edge)) {
      Eigen::Vector2d t;
      t << -normals(1, edge_idx), normals(0, edge_idx);
      element_vector[edge_idx + 3] = dirichlet_data_(edge).transpose() * t;
    }
  }
  return element_vector;
}